

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void NavUpdateWindowingHighlightWindow(int focus_change_dir)

{
  ImGuiContext *pIVar1;
  int i_start;
  ImGuiWindow *pIVar2;
  ImGuiWindow *window_target;
  int i_current;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  
  pIVar1 = GImGui;
  if ((GImGui->NavWindowingTarget->Flags & 0x8000000U) == 0) {
    i_start = ImGui::FindWindowFocusIndex(GImGui->NavWindowingTarget);
    pIVar2 = FindWindowNavFocusable
                       (i_start,in_stack_ffffffffffffffe8,
                        (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    if (pIVar2 == (ImGuiWindow *)0x0) {
      pIVar2 = FindWindowNavFocusable(i_start,in_stack_ffffffffffffffe8,0);
    }
    if (pIVar2 != (ImGuiWindow *)0x0) {
      pIVar1->NavWindowingTargetAnim = pIVar2;
      pIVar1->NavWindowingTarget = pIVar2;
    }
    pIVar1->NavWindowingToggleLayer = false;
  }
  return;
}

Assistant:

static void NavUpdateWindowingHighlightWindow(int focus_change_dir)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget);
    if (g.NavWindowingTarget->Flags & ImGuiWindowFlags_Modal)
        return;

    const int i_current = ImGui::FindWindowFocusIndex(g.NavWindowingTarget);
    ImGuiWindow* window_target = FindWindowNavFocusable(i_current + focus_change_dir, -INT_MAX, focus_change_dir);
    if (!window_target)
        window_target = FindWindowNavFocusable((focus_change_dir < 0) ? (g.WindowsFocusOrder.Size - 1) : 0, i_current, focus_change_dir);
    if (window_target) // Don't reset windowing target if there's a single window in the list
        g.NavWindowingTarget = g.NavWindowingTargetAnim = window_target;
    g.NavWindowingToggleLayer = false;
}